

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::MenuBarStyle> __thiscall gui::DefaultTheme::makeMenuBarStyle(DefaultTheme *this)

{
  element_type *this_00;
  element_type *padding;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::MenuBarStyle> sVar1;
  shared_ptr<gui::MenuBarStyle> *style;
  Font *in_stack_ffffffffffffff88;
  MenuBarStyle *in_stack_ffffffffffffff90;
  Vector3<float> local_3c;
  Vector3<float> local_30 [2];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<gui::MenuBarStyle,gui::Gui_const&>((Gui *)in_RDI);
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a3bd);
  MenuBarStyle::setBarFillColor(in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a3d8);
  MenuBarStyle::setMenuFillColor(in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a3f3);
  MenuBarStyle::setMenuOutlineColor(in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a40e);
  MenuBarStyle::setMenuOutlineThickness
            (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a42a);
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator*
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)in_stack_ffffffffffffff90);
  MenuBarStyle::setFont(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a45f);
  MenuBarStyle::setCharacterSize
            (in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a478);
  MenuBarStyle::setTextFillColor(in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  this_00 = std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16a493);
  sf::Vector3<float>::Vector3(local_30,10.0,3.0,*(float *)(in_RSI + 0x50));
  MenuBarStyle::setBarTextPadding(this_00,(Vector3f *)in_stack_ffffffffffffff88);
  padding = std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16a4dc);
  sf::Vector3<float>::Vector3(&local_3c,18.0,3.0,*(float *)(in_RSI + 0x50));
  MenuBarStyle::setMenuTextPadding(this_00,(Vector3f *)padding);
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a523);
  MenuBarStyle::setMinLeftRightTextWidth(this_00,(float)((ulong)padding >> 0x20));
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a53f);
  MenuBarStyle::setDisabledTextFillColor(this_00,(Color *)padding);
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a55a);
  MenuBarStyle::setHighlightFillColor(this_00,(Color *)padding);
  std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a575);
  MenuBarStyle::setDisabledHighlightFillColor(this_00,(Color *)padding);
  sVar1.super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::MenuBarStyle>)
         sVar1.super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MenuBarStyle> DefaultTheme::makeMenuBarStyle() const {
    auto style = std::make_shared<MenuBarStyle>(gui_);
    style->setBarFillColor(colorLightGray);

    style->setMenuFillColor(sf::Color::White);
    style->setMenuOutlineColor(colorGray2);
    style->setMenuOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setBarTextPadding({10.0f, 3.0f, fontMaxHeightRatio_});
    style->setMenuTextPadding({18.0f, 3.0f, fontMaxHeightRatio_});
    style->setMinLeftRightTextWidth(40.0f);
    style->setDisabledTextFillColor(colorGray3);
    style->setHighlightFillColor(colorLightBlue);
    style->setDisabledHighlightFillColor(colorLightGray2);

    return style;
}